

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O1

void printPrimalSolution<double>
               (SoPlexBase<double> *soplex,NameSet *colnames,NameSet *rownames,bool real,
               bool rational)

{
  Tolerances *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ostream *poVar3;
  long lVar4;
  char cVar5;
  void *pvVar6;
  pointer pnVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  undefined7 in_register_00000009;
  Verbosity old_verbosity;
  Verbosity VVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  char *pcVar16;
  Verbosity old_verbosity_1;
  Real RVar17;
  double dVar18;
  Verbosity old_verbosity_7;
  VectorBase<double> primal;
  VectorRational primal_1;
  longlong local_128;
  undefined4 local_11c;
  data_type local_118;
  undefined5 local_108;
  char cStack_103;
  char cStack_102;
  undefined1 uStack_101;
  uint local_f8;
  void *local_f0;
  char local_e3;
  char local_e2;
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_d0;
  data_type local_b8;
  char local_a3;
  char local_a2;
  uint local_98;
  void *local_90;
  char local_83;
  char local_82;
  data_type local_78;
  char local_63;
  char local_62;
  uint local_58;
  void *local_50;
  char local_43;
  char local_42;
  
  pTVar1 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  RVar17 = ::soplex::Tolerances::epsilon(pTVar1);
  dVar18 = log10(RVar17);
  iVar15 = (int)-dVar18;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  iVar9 = iVar15 + 10;
  if ((char)rownames != '\0') {
    ::soplex::VectorBase<double>::VectorBase
              ((VectorBase<double> *)&local_118.ld,
               (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    bVar8 = ::soplex::SoPlexBase<double>::getPrimalRay(soplex,(VectorBase<double> *)&local_118.ld);
    local_11c = (undefined4)CONCAT71(in_register_00000009,real);
    if (bVar8) {
      VVar12 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar12) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nPrimal ray (name, value):\n",0x1b);
        (soplex->spxout).m_verbosity = VVar12;
      }
      if (0 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
        lVar13 = 0;
        do {
          dVar18 = *(double *)(CONCAT44(local_118.la[0]._4_4_,local_118.ld.capacity) + lVar13 * 8);
          pTVar1 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var2 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          RVar17 = ::soplex::Tolerances::epsilon(pTVar1);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if ((RVar17 < ABS(dVar18)) && (VVar12 = (soplex->spxout).m_verbosity, 2 < (int)VVar12)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar3 = (soplex->spxout).m_streams[3];
            if (colnames->mem == (char *)0x0) {
              std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
            }
            else {
              pcVar16 = colnames->mem +
                        (colnames->set).theitem[(colnames->set).thekey[lVar13].idx].data;
              sVar11 = strlen(pcVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar16,sVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            lVar14 = *(long *)poVar3;
            *(long *)(poVar3 + *(long *)(lVar14 + -0x18) + 0x10) = (long)iVar9;
            *(long *)(poVar3 + *(long *)(lVar14 + -0x18) + 8) = (long)iVar15;
            std::ostream::_M_insert<double>
                      (*(double *)
                        (CONCAT44(local_118.la[0]._4_4_,local_118.ld.capacity) + lVar13 * 8));
            poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar5 = (char)poVar3;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            (soplex->spxout).m_verbosity = VVar12;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                          thenum);
      }
      VVar12 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar12) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other entries are zero (within ",0x23);
        poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar13 = *(long *)poVar3;
        *(undefined8 *)(poVar3 + *(long *)(lVar13 + -0x18) + 8) = 1;
        lVar13 = *(long *)(lVar13 + -0x18);
        *(uint *)(poVar3 + lVar13 + 0x18) = *(uint *)(poVar3 + lVar13 + 0x18) & 0xfffffefb | 0x100;
        pTVar1 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var2 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        RVar17 = ::soplex::Tolerances::epsilon(pTVar1);
        std::ostream::_M_insert<double>(RVar17);
        poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar13 = *(long *)poVar3;
        *(undefined8 *)(poVar3 + *(long *)(lVar13 + -0x18) + 8) = 8;
        lVar13 = *(long *)(lVar13 + -0x18);
        *(uint *)(poVar3 + lVar13 + 0x18) = *(uint *)(poVar3 + lVar13 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,").",2);
        poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar5 = (char)poVar3;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
joined_r0x0012e7e6:
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
LAB_0012dfd9:
        (soplex->spxout).m_verbosity = VVar12;
      }
    }
    else if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x98 & 1) != 0)) ||
             ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0))))
            && (bVar8 = ::soplex::SoPlexBase<double>::getPrimal
                                  (soplex,(VectorBase<double> *)&local_118.ld), bVar8)) {
      VVar12 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar12) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nPrimal solution (name, value):\n",0x20);
        (soplex->spxout).m_verbosity = VVar12;
      }
      if ((soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum < 1) {
        iVar10 = 0;
      }
      else {
        lVar13 = 0;
        iVar10 = 0;
        do {
          dVar18 = *(double *)(CONCAT44(local_118.la[0]._4_4_,local_118.ld.capacity) + lVar13 * 8);
          pTVar1 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var2 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          RVar17 = ::soplex::Tolerances::epsilon(pTVar1);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if (RVar17 < ABS(dVar18)) {
            VVar12 = (soplex->spxout).m_verbosity;
            if (2 < (int)VVar12) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar3 = (soplex->spxout).m_streams[3];
              if (colnames->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar3 + -0x18) + (int)poVar3);
              }
              else {
                pcVar16 = colnames->mem +
                          (colnames->set).theitem[(colnames->set).thekey[lVar13].idx].data;
                sVar11 = strlen(pcVar16);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar16,sVar11);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              lVar14 = *(long *)poVar3;
              *(long *)(poVar3 + *(long *)(lVar14 + -0x18) + 0x10) = (long)iVar9;
              *(long *)(poVar3 + *(long *)(lVar14 + -0x18) + 8) = (long)iVar15;
              std::ostream::_M_insert<double>
                        (*(double *)
                          (CONCAT44(local_118.la[0]._4_4_,local_118.ld.capacity) + lVar13 * 8));
              poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar5 = (char)poVar3;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
              std::ostream::put(cVar5);
              std::ostream::flush();
              (soplex->spxout).m_verbosity = VVar12;
            }
            iVar10 = iVar10 + 1;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                          thenum);
      }
      VVar12 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar12) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other variables are zero (within ",0x25);
        poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar13 = *(long *)poVar3;
        *(undefined8 *)(poVar3 + *(long *)(lVar13 + -0x18) + 8) = 1;
        lVar13 = *(long *)(lVar13 + -0x18);
        *(uint *)(poVar3 + lVar13 + 0x18) = *(uint *)(poVar3 + lVar13 + 0x18) & 0xfffffefb | 0x100;
        pTVar1 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var2 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        RVar17 = ::soplex::Tolerances::epsilon(pTVar1);
        std::ostream::_M_insert<double>(RVar17);
        poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar13 = *(long *)poVar3;
        *(undefined8 *)(poVar3 + *(long *)(lVar13 + -0x18) + 8) = 8;
        lVar13 = *(long *)(lVar13 + -0x18);
        *(uint *)(poVar3 + lVar13 + 0x18) = *(uint *)(poVar3 + lVar13 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"). Solution has ",0x10);
        std::ostream::operator<<
                  ((ostream *)(soplex->spxout).m_streams[(soplex->spxout).m_verbosity],iVar10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity]," nonzero entries.",0x11
                  );
        poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar5 = (char)poVar3;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        goto joined_r0x0012e7e6;
      }
    }
    else {
      VVar12 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar12) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No primal information available.\n",0x21);
        goto LAB_0012dfd9;
      }
    }
    pvVar6 = (void *)CONCAT44(local_118.la[0]._4_4_,local_118.ld.capacity);
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,CONCAT17(uStack_101,CONCAT16(cStack_102,CONCAT15(cStack_103,local_108))
                                     ) - (long)pvVar6);
    }
    real = SUB41(local_11c,0);
  }
  if (real == false) {
    return;
  }
  ::soplex::
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_d0,
               (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  bVar8 = ::soplex::SoPlexBase<double>::getPrimalRayRational
                    (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                             *)&local_d0);
  if (bVar8) {
    VVar12 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar12) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"\nPrimal ray (name, value):\n",0x1b);
      (soplex->spxout).m_verbosity = VVar12;
    }
    if (0 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
      lVar13 = 0;
      lVar14 = 0;
      do {
        pnVar7 = local_d0.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_128 = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_118.ld,&local_128,(type *)0x0);
        iVar10 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)((long)&(pnVar7->m_backend).m_value.num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + lVar13),
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_118.ld);
        if ((local_e3 == '\0') && (local_e2 == '\0')) {
          operator_delete(local_f0,(ulong)local_f8 << 3);
        }
        if ((cStack_103 == '\0') && (cStack_102 == '\0')) {
          operator_delete(local_118.ld.data,(ulong)local_118.ld.capacity << 3);
        }
        if ((iVar10 != 0) && (VVar12 = (soplex->spxout).m_verbosity, 2 < (int)VVar12)) {
          (soplex->spxout).m_verbosity = INFO1;
          poVar3 = (soplex->spxout).m_streams[3];
          if (colnames->mem == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(*(long *)poVar3 + -0x18) + (int)poVar3);
          }
          else {
            pcVar16 = colnames->mem +
                      (colnames->set).theitem[(colnames->set).thekey[lVar14].idx].data;
            sVar11 = strlen(pcVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar16,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
          poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          lVar4 = *(long *)poVar3;
          *(long *)(poVar3 + *(long *)(lVar4 + -0x18) + 0x10) = (long)iVar9;
          *(long *)(poVar3 + *(long *)(lVar4 + -0x18) + 8) = (long)iVar15;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_78.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&((local_d0.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                        m_value.num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar13));
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_78.ld);
          poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          cVar5 = (char)poVar3;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          if ((local_43 == '\0') && (local_42 == '\0')) {
            operator_delete(local_50,(ulong)local_58 << 3);
          }
          if ((local_63 == '\0') && (local_62 == '\0')) {
            operator_delete(local_78.ld.data,(ulong)local_78.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar12;
        }
        lVar14 = lVar14 + 1;
        lVar13 = lVar13 + 0x40;
      } while (lVar14 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                        thenum);
    }
    VVar12 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar12) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"All other entries are zero.",0x1b);
      poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      cVar5 = (char)poVar3;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      (soplex->spxout).m_verbosity = VVar12;
    }
  }
  if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x98 & 1) != 0)) ||
      ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0)))) &&
     (bVar8 = ::soplex::SoPlexBase<double>::getPrimalRational
                        (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                 *)&local_d0), bVar8)) {
    VVar12 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar12) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"\nPrimal solution (name, value):\n",0x20);
      (soplex->spxout).m_verbosity = VVar12;
    }
    if ((soplex->_rationalLP->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .set.thenum < 1) {
      iVar15 = 0;
    }
    else {
      lVar13 = 0;
      lVar14 = 0;
      iVar15 = 0;
      do {
        pnVar7 = local_d0.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_128 = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_118.ld,&local_128,(type *)0x0);
        iVar9 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)((long)&(pnVar7->m_backend).m_value.num.m_backend.
                                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                     .m_data + lVar13),
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_118.ld);
        if ((local_e3 == '\0') && (local_e2 == '\0')) {
          operator_delete(local_f0,(ulong)local_f8 << 3);
        }
        if ((cStack_103 == '\0') && (cStack_102 == '\0')) {
          operator_delete(local_118.ld.data,(ulong)local_118.ld.capacity << 3);
        }
        if (iVar9 != 0) {
          VVar12 = (soplex->spxout).m_verbosity;
          if (2 < (int)VVar12) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar3 = (soplex->spxout).m_streams[3];
            if (colnames->mem == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar3 + -0x18) + (int)poVar3);
            }
            else {
              pcVar16 = colnames->mem +
                        (colnames->set).theitem[(colnames->set).thekey[lVar14].idx].data;
              sVar11 = strlen(pcVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar16,sVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_b8.ld,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)((long)&((local_d0.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                          m_value.num.m_backend.
                                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                          .m_data + lVar13));
            boost::multiprecision::operator<<
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                       (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_b8.ld);
            poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar5 = (char)poVar3;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            if ((local_83 == '\0') && (local_82 == '\0')) {
              operator_delete(local_90,(ulong)local_98 << 3);
            }
            if ((local_a3 == '\0') && (local_a2 == '\0')) {
              operator_delete(local_b8.ld.data,(ulong)local_b8.ld.capacity << 3);
            }
            (soplex->spxout).m_verbosity = VVar12;
          }
          iVar15 = iVar15 + 1;
        }
        lVar14 = lVar14 + 1;
        lVar13 = lVar13 + 0x40;
      } while (lVar14 < (soplex->_rationalLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        .set.thenum);
    }
    VVar12 = (soplex->spxout).m_verbosity;
    if ((int)VVar12 < 3) goto LAB_0012e687;
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[3],"All other variables are zero. Solution has ",0x2b);
    std::ostream::operator<<
              ((ostream *)(soplex->spxout).m_streams[(soplex->spxout).m_verbosity],iVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity]," nonzero entries.",0x11);
    poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
    cVar5 = (char)poVar3;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
  }
  else {
    VVar12 = (soplex->spxout).m_verbosity;
    if ((int)VVar12 < 3) goto LAB_0012e687;
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[3],"No primal (rational) solution available.\n",0x29);
  }
  (soplex->spxout).m_verbosity = VVar12;
LAB_0012e687:
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::~vector(&local_d0);
  return;
}

Assistant:

static
void printPrimalSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                         bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << ")." << std::endl;)
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal information available.\n")
      }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero. Solution has "
                       << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal (rational) solution available.\n")

      }
}